

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::ShouldWarnIfNoTestsMatchFilter(UnitTestImpl *this)

{
  TestSuite *this_00;
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this_01;
  reference ppTVar4;
  string *test_name;
  TestInfo *test_info;
  iterator __end3;
  iterator __begin3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *__range3;
  string *test_suite_name;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  UnitTestImpl *this_local;
  
  gtest_flag_filter.negative_filter_.exact_match_patterns_._M_h._M_single_bucket =
       (__node_base_ptr)this;
  iVar2 = total_test_count(this);
  if (iVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
              ((PositiveAndNegativeUnitTestFilter *)&__range2,
               (string *)FLAGS_gtest_filter_abi_cxx11_);
    __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                       (&this->test_suites_);
    test_suite = (TestSuite *)
                 std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                           (&this->test_suites_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                  *)&test_suite);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppTVar3;
      this_01 = TestSuite::test_info_list(this_00);
      __end3 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                         (this_01);
      test_info = (TestInfo *)
                  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
                            (this_01);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                                    *)&test_info);
        if (!bVar1) break;
        ppTVar4 = __gnu_cxx::
                  __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                  ::operator*(&__end3);
        bVar1 = anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                          ((PositiveAndNegativeUnitTestFilter *)&__range2,&this_00->name_,
                           &(*ppTVar4)->name_);
        if (bVar1) {
          this_local._7_1_ = false;
          goto LAB_0062407d;
        }
        __gnu_cxx::
        __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
LAB_0062407d:
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
              ((PositiveAndNegativeUnitTestFilter *)&__range2);
  }
  return this_local._7_1_;
}

Assistant:

bool UnitTestImpl::ShouldWarnIfNoTestsMatchFilter() const {
  if (total_test_count() == 0) {
    // No tests were linked in to program.
    // This case is handled by a different warning.
    return false;
  }
  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      if (gtest_flag_filter.MatchesTest(test_suite_name, test_name)) {
        return false;
      }
    }
  }
  return true;
}